

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O3

void __thiscall
duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>::
Combine<duckdb::ArgMinMaxState<double,duckdb::string_t>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
          (ArgMinMaxBase<duckdb::GreaterThan,true> *this,
          ArgMinMaxState<double,_duckdb::string_t> *source,
          ArgMinMaxState<double,_duckdb::string_t> *target,AggregateInputData *param_3)

{
  bool bVar1;
  string_t new_value;
  
  if ((*this == (ArgMinMaxBase<duckdb::GreaterThan,true>)0x1) &&
     (((source->super_ArgMinMaxStateBase).is_initialized != true ||
      (bVar1 = string_t::StringComparisonOperators::GreaterThan
                         ((string_t *)(this + 0x10),&source->value), bVar1)))) {
    source->arg = *(ARG_TYPE_conflict1 *)(this + 8);
    new_value.value.pointer.ptr = (char *)param_3;
    new_value.value._0_8_ = *(undefined8 *)(this + 0x18);
    ArgMinMaxStateBase::AssignValue<duckdb::string_t>
              ((ArgMinMaxStateBase *)&source->value,*(string_t **)(this + 0x10),new_value);
    (source->super_ArgMinMaxStateBase).is_initialized = true;
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.is_initialized) {
			return;
		}
		if (!target.is_initialized || COMPARATOR::Operation(source.value, target.value)) {
			Assign(target, source.arg, source.value, source.arg_null);
			target.is_initialized = true;
		}
	}